

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.h
# Opt level: O0

string * aeron::Context::getUserName_abi_cxx11_(void)

{
  char *pcVar1;
  string *in_RDI;
  allocator local_19;
  char *local_18;
  char *username;
  
  local_18 = getenv("USER");
  if (local_18 == (char *)0x0) {
    local_18 = "default";
  }
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,pcVar1,&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  return in_RDI;
}

Assistant:

inline static std::string getUserName()
    {
        const char *username = ::getenv("USER");
#if (_MSC_VER)
        if (nullptr == username)
        {
            username = ::getenv("USERNAME");
            if (nullptr == username)
            {
                 username = "default";
            }
        }
#else
        if (nullptr == username)
        {
            username = "default";
        }
#endif
        return username;
    }